

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte bVar1;
  bool bVar2;
  ReservedChars RVar3;
  char *saved_cursor;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  TokenType TVar7;
  long lVar8;
  size_t sVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint uVar12;
  anon_class_8_1_8991fb9c column;
  string_view name;
  Token local_70;
  
  pbVar5 = (byte *)this->buffer_end_;
  pbVar4 = (byte *)this->cursor_;
  this->token_start_ = (char *)pbVar4;
  if (pbVar4 < pbVar5) {
    do {
      bVar1 = *pbVar4;
      if (bVar1 < 0x61) {
        switch(bVar1) {
        case 9:
        case 10:
        case 0xd:
        case 0x20:
          ReadWhitespace(this);
          goto LAB_0017c691;
        default:
          goto switchD_0017c4fc_caseD_b;
        case 0x22:
          GetStringToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x24:
          RVar3 = ReadReservedChars(this);
          TVar7 = (uint)(RVar3 == Id) * 2 + Reserved;
          goto LAB_0017c869;
        case 0x28:
          lVar8 = 0;
          pbVar10 = pbVar4;
          do {
            uVar12 = 0xffffffff;
            pbVar11 = pbVar10;
            if (pbVar10 < pbVar5) {
              pbVar11 = pbVar10 + 1;
              this->cursor_ = (char *)pbVar11;
              uVar12 = (uint)*pbVar10;
            }
            if (uVar12 != (int)"(;"[lVar8]) {
              this->cursor_ = (char *)pbVar4;
              lVar8 = 0;
              pbVar10 = pbVar4;
              goto LAB_0017c6db;
            }
            lVar8 = lVar8 + 1;
            pbVar10 = pbVar11;
          } while (lVar8 != 2);
          bVar2 = ReadBlockComment(this);
          break;
        case 0x29:
          this->cursor_ = (char *)(pbVar4 + 1);
          TVar7 = Rpar;
          goto LAB_0017c6b1;
        case 0x2b:
        case 0x2d:
          pbVar4 = pbVar4 + 1;
          this->cursor_ = (char *)pbVar4;
          if (pbVar4 < pbVar5) {
            bVar1 = *pbVar4;
            if (bVar1 - 0x31 < 9) goto LAB_0017c762;
            if (bVar1 == 0x6e) goto LAB_0017c901;
            if (bVar1 == 0x69) goto LAB_0017c8f1;
            if (bVar1 == 0x30) {
              lVar8 = 0;
              pbVar10 = pbVar4;
              goto LAB_0017c8a4;
            }
          }
          GetReservedToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        case 0x30:
          lVar8 = 0;
          pbVar10 = pbVar4;
          goto LAB_0017c77e;
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          goto switchD_0017c4fc_caseD_31;
        case 0x3b:
          lVar8 = 0;
          pbVar10 = pbVar4;
          do {
            uVar12 = 0xffffffff;
            pbVar11 = pbVar10;
            if (pbVar10 < pbVar5) {
              pbVar11 = pbVar10 + 1;
              this->cursor_ = (char *)pbVar11;
              uVar12 = (uint)*pbVar10;
            }
            if (uVar12 != (int)";;"[lVar8]) {
              this->cursor_ = (char *)(pbVar4 + 1);
              goto LAB_0017c677;
            }
            lVar8 = lVar8 + 1;
            pbVar10 = pbVar11;
          } while (lVar8 != 2);
          bVar2 = ReadLineComment(this);
        }
        if (bVar2 == false) break;
      }
      else {
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x61) {
            pcVar6 = "align=";
            sVar9 = 6;
            TVar7 = AlignEqNat;
LAB_0017c83c:
            name._M_str = pcVar6;
            name._M_len = sVar9;
            GetNameEqNumToken(__return_storage_ptr__,this,name,TVar7);
            return __return_storage_ptr__;
          }
          if (bVar1 == 0x69) {
LAB_0017c8f1:
            GetInfToken(__return_storage_ptr__,this);
            return __return_storage_ptr__;
          }
        }
        else {
          if (bVar1 == 0x6e) {
LAB_0017c901:
            GetNanToken(__return_storage_ptr__,this);
            return __return_storage_ptr__;
          }
          if (bVar1 == 0x6f) {
            pcVar6 = "offset=";
            sVar9 = 7;
            TVar7 = OffsetEqNat;
            goto LAB_0017c83c;
          }
        }
switchD_0017c4fc_caseD_b:
        if ((""[(ulong)bVar1 + 1] & 2U) != 0) {
          GetKeywordToken(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        if ((""[(ulong)bVar1 + 1] & 1U) != 0) {
          ReadReservedChars(this);
          TVar7 = Reserved;
LAB_0017c869:
          sVar9 = 0;
          goto LAB_0017c725;
        }
        this->cursor_ = (char *)(pbVar4 + 1);
LAB_0017c677:
        Error(this,0x1e8f19);
      }
LAB_0017c691:
      pbVar5 = (byte *)this->buffer_end_;
      pbVar4 = (byte *)this->cursor_;
      this->token_start_ = (char *)pbVar4;
    } while (pbVar4 < pbVar5);
  }
  TVar7 = Eof;
LAB_0017c6b1:
  BareToken(__return_storage_ptr__,this,TVar7);
  return __return_storage_ptr__;
  while (lVar8 = lVar8 + 1, pbVar10 = pbVar11, lVar8 != 2) {
LAB_0017c77e:
    uVar12 = 0xffffffff;
    pbVar11 = pbVar10;
    if (pbVar10 < pbVar5) {
      pbVar11 = pbVar10 + 1;
      this->cursor_ = (char *)pbVar11;
      uVar12 = (uint)*pbVar10;
    }
    if (uVar12 != (int)":0x"[lVar8 + 1]) {
      this->cursor_ = (char *)pbVar4;
switchD_0017c4fc_caseD_31:
      TVar7 = Last_Literal;
      goto LAB_0017c87f;
    }
  }
  TVar7 = Last_Literal;
  goto LAB_0017c7ba;
LAB_0017c6db:
  uVar12 = 0xffffffff;
  pbVar11 = pbVar10;
  if (pbVar10 < pbVar5) {
    pbVar11 = pbVar10 + 1;
    this->cursor_ = (char *)pbVar11;
    uVar12 = (uint)*pbVar10;
  }
  if (uVar12 != (int)"(@"[lVar8]) {
    this->cursor_ = (char *)(pbVar4 + 1);
    TVar7 = Lpar;
    goto LAB_0017c6b1;
  }
  lVar8 = lVar8 + 1;
  pbVar10 = pbVar11;
  if (lVar8 == 2) {
    GetIdChars(&local_70,this);
    sVar9 = 2;
    TVar7 = LparAnn;
LAB_0017c725:
    TextToken(__return_storage_ptr__,this,TVar7,sVar9);
    return __return_storage_ptr__;
  }
  goto LAB_0017c6db;
  while (lVar8 = lVar8 + 1, pbVar10 = pbVar11, lVar8 != 2) {
LAB_0017c8a4:
    uVar12 = 0xffffffff;
    pbVar11 = pbVar10;
    if (pbVar10 < pbVar5) {
      pbVar11 = pbVar10 + 1;
      this->cursor_ = (char *)pbVar11;
      uVar12 = (uint)*pbVar10;
    }
    if (uVar12 != (int)":0x"[lVar8 + 1]) {
      this->cursor_ = (char *)pbVar4;
LAB_0017c762:
      TVar7 = Int;
LAB_0017c87f:
      GetNumberToken(__return_storage_ptr__,this,TVar7);
      return __return_storage_ptr__;
    }
  }
  TVar7 = Int;
LAB_0017c7ba:
  GetHexNumberToken(__return_storage_ptr__,this,TVar7);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken() {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          GetIdChars();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken();

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdChars();  // Initial $ is idchar, so this produces id token

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsIdChar(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}